

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __normal_iterator<char_const*,std::__cxx11::string> *this;
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  reference pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  iterator local_160;
  undefined1 local_119;
  undefined1 local_118 [7];
  bool r;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attr;
  iterator theEnd;
  iterator iter;
  __normal_iterator<char_const*,std::__cxx11::string> local_78 [8];
  undefined1 local_70 [8];
  lexer lex;
  iterator iend;
  iterator ibeg;
  allocator local_39;
  string local_38 [8];
  string input;
  char **argv_local;
  int argc_local;
  
  input.field_2._8_8_ = argv;
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Need something to parse\n");
    argv_local._4_4_ = 1;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    iend._M_current = (char *)std::__cxx11::string::begin();
    lex.m_end._M_current = (char *)std::__cxx11::string::end();
    poVar3 = std::operator<<((ostream *)&std::cout,"Parsing : ");
    poVar3 = std::operator<<(poVar3,local_38);
    std::operator<<(poVar3,"\n");
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              (local_78,&iend);
    this = (__normal_iterator<char_const*,std::__cxx11::string> *)
           (iter.m_curr_tok.lexeme.field_2._M_local_buf + 8);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              (this,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&lex.m_end);
    lexer::lexer((lexer *)local_70,(iit *)local_78,(iit *)this);
    lexer::begin((iterator *)((long)&theEnd.m_curr_tok.lexeme.field_2 + 8),(lexer *)local_70);
    lexer::end((iterator *)
               &attr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(lexer *)local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_118);
    lexer::iterator::iterator
              (&local_160,
               (iterator *)
               &attr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = boost::spirit::x3::
            parse<lexer::iterator,boost::spirit::x3::plus<boost::spirit::x3::alternative<boost::spirit::x3::sequence<boost::spirit::x3::sequence<tok_kw,tok_sym>,tok_kw>,boost::spirit::x3::sequence<boost::spirit::x3::sequence<boost::spirit::x3::sequence<boost::spirit::x3::sequence<tok_kw,tok_sym>,tok_kw>,tok_kw>,tok_kw>>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((iterator *)((long)&theEnd.m_curr_tok.lexeme.field_2 + 8),&local_160,&program
                       ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_118);
    lexer::iterator::~iterator(&local_160);
    local_119 = bVar2;
    if (bVar2) {
      bVar2 = lexer::iterator::operator!=
                        ((iterator *)((long)&theEnd.m_curr_tok.lexeme.field_2 + 8),
                         (self_type *)
                         &attr.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"FAILED: didn\'t parse all the output\n");
        argv_local._4_4_ = 1;
      }
      else {
        std::operator<<((ostream *)&std::cout,"SUCCESS: Good Input\n");
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_118);
        a = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_118);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&a);
          if (!bVar2) break;
          pbVar4 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
          poVar3 = std::operator<<((ostream *)&std::cout,(string *)pbVar4);
          std::operator<<(poVar3,"\n");
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        argv_local._4_4_ = 0;
      }
    }
    else {
      std::operator<<((ostream *)&std::cout,"FAILED: returned failure\n");
      argv_local._4_4_ = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_118);
    lexer::iterator::~iterator
              ((iterator *)
               &attr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    lexer::iterator::~iterator((iterator *)((long)&theEnd.m_curr_tok.lexeme.field_2 + 8));
    std::__cxx11::string::~string(local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    if (argc < 2) {
        std::cout << "Need something to parse\n";
        return 1;
    }

    std::string input(argv[1]);
    auto ibeg = input.begin();
    auto iend = input.end();
    
    std::cout << "Parsing : " << input << "\n";
    lexer lex(ibeg, iend);
    
    auto iter = lex.begin();
    auto theEnd = lex.end();

    std::vector<std::string> attr;
    
    
    bool r = x3::parse(iter, theEnd, program, attr);
    if (r) {
        if (iter != theEnd) {
            std::cout << "FAILED: didn't parse all the output\n";
            return 1;
        } else {
            std::cout << "SUCCESS: Good Input\n";
            for (auto const&a : attr) {
                std::cout << a << "\n";
            }
            return 0;
        }
    } else {
        std::cout << "FAILED: returned failure\n";
        return 1;
    }

}